

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::buildPMT(TSMuxer *this)

{
  uint32_t uVar1;
  uint8_t *this_00;
  long local_48;
  int64_t roundSize;
  int64_t oldPmtSize;
  TSPacket *tsPacket2;
  uint8_t *curPos;
  uint8_t *pmtEnd;
  uint32_t size;
  TSPacket *tsPacket;
  TSMuxer *this_local;
  
  this->m_pmtBuffer[0] = 'G';
  this->m_pmtBuffer[1] = '\0';
  this->m_pmtBuffer[2] = '\0';
  this->m_pmtBuffer[3] = '\x10';
  this_00 = this->m_pmtBuffer;
  TSPacket::setPID((TSPacket *)this_00,0x100);
  *(uint *)this_00 = *(uint *)this_00 & 0xefffffff | 0x10000000;
  *(uint *)this_00 = *(uint *)this_00 & 0xffffbfff | 0x4000;
  uVar1 = TS_program_map_section::serialize
                    (&this->m_pmt,this->m_pmtBuffer + 4,0xf18,(bool)(this->m_bluRayMode & 1),
                     (bool)(this->m_hdmvDescriptors & 1));
  curPos = this->m_pmtBuffer + (ulong)uVar1 + 4;
  for (tsPacket2 = (TSPacket *)(this->m_pmtBuffer + 0xbc); tsPacket2 < curPos;
      tsPacket2 = (TSPacket *)&tsPacket2[0x17].adaptiveField) {
    memmove(&tsPacket2->adaptiveField,tsPacket2,(long)curPos - (long)tsPacket2);
    curPos = curPos + 4;
    *(undefined4 *)tsPacket2 = 0x10000047;
    TSPacket::setPID(tsPacket2,0x100);
    *(uint *)tsPacket2 = *(uint *)tsPacket2 & 0xefffffff | 0x10000000;
    *(uint *)tsPacket2 = *(uint *)tsPacket2 & 0xffffbfff;
  }
  local_48 = (long)curPos - (long)this->m_pmtBuffer;
  if (local_48 % 0xbc != 0) {
    local_48 = (local_48 / 0xbc + 1) * 0xbc;
  }
  memset(curPos,0xff,local_48 - ((long)curPos - (long)this->m_pmtBuffer));
  this->m_pmtFrames = local_48 / 0xbc;
  return;
}

Assistant:

void TSMuxer::buildPMT()
{
    *reinterpret_cast<uint32_t*>(m_pmtBuffer) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_pmtBuffer);
    tsPacket->setPID(DEFAULT_PMT_PID);
    tsPacket->dataExists = 1;
    tsPacket->payloadStart = 1;
    const uint32_t size =
        m_pmt.serialize(m_pmtBuffer + TSPacket::TS_HEADER_SIZE, 3864, m_bluRayMode, m_hdmvDescriptors);
    uint8_t* pmtEnd = m_pmtBuffer + TSPacket::TS_HEADER_SIZE + size;
    uint8_t* curPos = m_pmtBuffer + TS_FRAME_SIZE;
    for (; curPos < pmtEnd; curPos += TS_FRAME_SIZE)
    {
        memmove(curPos + 4, curPos, pmtEnd - curPos);
        pmtEnd += 4;
        *reinterpret_cast<uint32_t*>(curPos) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket2 = reinterpret_cast<TSPacket*>(curPos);
        tsPacket2->setPID(DEFAULT_PMT_PID);
        tsPacket2->dataExists = 1;
        tsPacket2->payloadStart = 0;
    }
    const int64_t oldPmtSize = pmtEnd - m_pmtBuffer;
    int64_t roundSize = pmtEnd - m_pmtBuffer;
    if (roundSize % TS_FRAME_SIZE != 0)
        roundSize = (roundSize / TS_FRAME_SIZE + 1) * TS_FRAME_SIZE;
    memset(pmtEnd, 0xff, roundSize - oldPmtSize);
    m_pmtFrames = roundSize / TS_FRAME_SIZE;
}